

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

int __thiscall Pathie::Path::rmdir(Path *this,char *__path)

{
  int iVar1;
  char *__path_00;
  ErrnoError *this_00;
  int *piVar2;
  undefined1 local_30 [8];
  string nstr;
  Path *this_local;
  
  native_abi_cxx11_((Path *)local_30);
  __path_00 = (char *)std::__cxx11::string::c_str();
  iVar1 = ::rmdir(__path_00);
  if (iVar1 < 0) {
    this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
    piVar2 = __errno_location();
    ErrnoError::ErrnoError(this_00,*piVar2);
    __cxa_throw(this_00,&ErrnoError::typeinfo,ErrnoError::~ErrnoError);
  }
  iVar1 = std::__cxx11::string::~string((string *)local_30);
  return iVar1;
}

Assistant:

void Path::rmdir() const
{
#if defined(_PATHIE_UNIX)
  std::string nstr = native();

  if (::rmdir(nstr.c_str()) < 0)
    throw(Pathie::ErrnoError(errno));
#elif defined(_WIN32)
  std::wstring utf16 = utf8_to_utf16(m_path);
  if (_wrmdir(utf16.c_str()) < 0)
    throw(Pathie::ErrnoError(errno));
#else
#error Unsupported system.
#endif
}